

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dim.h
# Opt level: O0

int __thiscall cnn::Dim::truncate(Dim *this,char *__file,__off_t __length)

{
  uint uVar1;
  uint uVar2;
  uint i;
  uint s;
  uint m;
  uint in_stack_ffffffffffffffcc;
  Dim *this_00;
  undefined4 local_14;
  undefined4 local_c;
  
  this_00 = this;
  memcpy(this,__file,0x24);
  local_c = 1;
  uVar1 = size(this_00);
  for (local_14 = 1; local_14 < uVar1; local_14 = local_14 + 1) {
    uVar2 = size(this_00,in_stack_ffffffffffffffcc);
    if (1 < uVar2) {
      local_c = local_14 + 1;
    }
  }
  resize(this_00,local_c);
  return (int)this;
}

Assistant:

inline Dim truncate() const {
    Dim r = *this;
    unsigned int m = 1;
    unsigned int s = size();
    for (unsigned int i = 1; i < s; ++i)
      if (size(i) > 1) m = i + 1;
    r.resize(m);
    return r;
  }